

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O1

node_handle_base<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>,_std::allocator<phmap::test_internal::MovableOnlyInstance>_>
* __thiscall
phmap::priv::
node_handle_base<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>,_std::allocator<phmap::test_internal::MovableOnlyInstance>_>
::operator=(node_handle_base<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>,_std::allocator<phmap::test_internal::MovableOnlyInstance>_>
            *this,node_handle_base<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>,_std::allocator<phmap::test_internal::MovableOnlyInstance>_>
                  *other)

{
  if ((this->alloc_).
      super__Optional_base<std::allocator<phmap::test_internal::MovableOnlyInstance>,_false,_false>.
      _M_payload.
      super__Optional_payload<std::allocator<phmap::test_internal::MovableOnlyInstance>,_true,_false,_false>
      .super__Optional_payload_base<std::allocator<phmap::test_internal::MovableOnlyInstance>_>.
      _M_engaged == true) {
    test_internal::BaseCountedInstance::num_instances_ =
         test_internal::BaseCountedInstance::num_instances_ + -1;
    if ((this->slot_space_).data[8] == '\x01') {
      test_internal::BaseCountedInstance::num_live_instances_ =
           test_internal::BaseCountedInstance::num_live_instances_ + -1;
    }
    (this->alloc_).
    super__Optional_base<std::allocator<phmap::test_internal::MovableOnlyInstance>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::allocator<phmap::test_internal::MovableOnlyInstance>,_true,_false,_false>
    .super__Optional_payload_base<std::allocator<phmap::test_internal::MovableOnlyInstance>_>.
    _M_engaged = false;
  }
  if ((other->alloc_).
      super__Optional_base<std::allocator<phmap::test_internal::MovableOnlyInstance>,_false,_false>.
      _M_payload.
      super__Optional_payload<std::allocator<phmap::test_internal::MovableOnlyInstance>,_true,_false,_false>
      .super__Optional_payload_base<std::allocator<phmap::test_internal::MovableOnlyInstance>_>.
      _M_engaged == true) {
    if ((this->alloc_).
        super__Optional_base<std::allocator<phmap::test_internal::MovableOnlyInstance>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::allocator<phmap::test_internal::MovableOnlyInstance>,_true,_false,_false>
        .super__Optional_payload_base<std::allocator<phmap::test_internal::MovableOnlyInstance>_>.
        _M_engaged == true) {
      (this->alloc_).
      super__Optional_base<std::allocator<phmap::test_internal::MovableOnlyInstance>,_false,_false>.
      _M_payload.
      super__Optional_payload<std::allocator<phmap::test_internal::MovableOnlyInstance>,_true,_false,_false>
      .super__Optional_payload_base<std::allocator<phmap::test_internal::MovableOnlyInstance>_>.
      _M_engaged = false;
    }
    (this->alloc_).
    super__Optional_base<std::allocator<phmap::test_internal::MovableOnlyInstance>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::allocator<phmap::test_internal::MovableOnlyInstance>,_true,_false,_false>
    .super__Optional_payload_base<std::allocator<phmap::test_internal::MovableOnlyInstance>_>.
    _M_engaged = true;
    if ((other->alloc_).
        super__Optional_base<std::allocator<phmap::test_internal::MovableOnlyInstance>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::allocator<phmap::test_internal::MovableOnlyInstance>,_true,_false,_false>
        .super__Optional_payload_base<std::allocator<phmap::test_internal::MovableOnlyInstance>_>.
        _M_engaged == false) {
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                    ,0xb09,
                    "slot_type *phmap::priv::node_handle_base<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::Less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 256, false>, std::allocator<phmap::test_internal::MovableOnlyInstance>>::slot() const [PolicyTraits = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::Less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 256, false>, Alloc = std::allocator<phmap::test_internal::MovableOnlyInstance>]"
                   );
    }
    *(undefined8 *)(this->slot_space_).data = *(undefined8 *)(other->slot_space_).data;
    (this->slot_space_).data[8] = (other->slot_space_).data[8];
    (other->slot_space_).data[8] = '\0';
    test_internal::BaseCountedInstance::num_moves_ =
         test_internal::BaseCountedInstance::num_moves_ + 1;
    (other->alloc_).
    super__Optional_base<std::allocator<phmap::test_internal::MovableOnlyInstance>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::allocator<phmap::test_internal::MovableOnlyInstance>,_true,_false,_false>
    .super__Optional_payload_base<std::allocator<phmap::test_internal::MovableOnlyInstance>_>.
    _M_engaged = false;
  }
  return this;
}

Assistant:

void destroy() {
        if (!empty()) {
            PolicyTraits::destroy(alloc(), slot());
            reset();
        }
    }